

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MMDPmxParser.cpp
# Opt level: O0

void __thiscall pmx::PmxModel::Read(PmxModel *this,istream *stream)

{
  int iVar1;
  ostream *poVar2;
  DeadlyImportError *pDVar3;
  type this_00;
  type piVar4;
  type this_01;
  type this_02;
  type this_03;
  type this_04;
  type this_05;
  type this_06;
  type this_07;
  uint8_t in_CL;
  int local_1cc;
  int i_8;
  int local_1bc;
  int i_7;
  int local_1ac;
  int i_6;
  int local_19c;
  int i_5;
  int local_18c;
  int i_4;
  int local_17c;
  int i_3;
  string local_170;
  int local_14c;
  int i_2;
  int local_13c;
  int i_1;
  int local_12c;
  int i;
  string local_120;
  string local_100;
  string local_e0;
  string local_c0;
  undefined1 local_99;
  string local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  undefined1 local_55;
  allocator local_41;
  string local_40;
  char local_1c;
  char local_1b;
  char local_1a;
  char local_19;
  istream *piStack_18;
  char magic [4];
  istream *stream_local;
  PmxModel *this_local;
  
  piStack_18 = stream;
  std::istream::read((char *)stream,(long)&local_1c);
  if ((((local_1c == 'P') && (local_1b == 'M')) && (local_1a == 'X')) && (local_19 == ' ')) {
    std::istream::read((char *)piStack_18,(long)this);
    if (((this->version != 2.0) || (NAN(this->version))) &&
       ((this->version != 2.1 || (NAN(this->version))))) {
      poVar2 = std::operator<<((ostream *)&std::cerr,"this is not ver2.0 or ver2.1 but ");
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,this->version);
      poVar2 = std::operator<<(poVar2,".");
      std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
      local_99 = 1;
      pDVar3 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
      to_string<float>(&local_98,this->version);
      std::operator+(&local_78,"MMD: this is not ver2.0 or ver2.1 but ",&local_98);
      DeadlyImportError::DeadlyImportError(pDVar3,&local_78);
      local_99 = 0;
      __cxa_throw(pDVar3,&DeadlyImportError::typeinfo,DeadlyImportError::~DeadlyImportError);
    }
    PmxSetting::Read(&this->setting,piStack_18);
    ReadString_abi_cxx11_
              (&local_c0,(pmx *)piStack_18,(istream *)(ulong)(this->setting).encoding,in_CL);
    std::__cxx11::string::operator=((string *)&this->model_name,(string *)&local_c0);
    std::__cxx11::string::~string((string *)&local_c0);
    ReadString_abi_cxx11_
              (&local_e0,(pmx *)piStack_18,(istream *)(ulong)(this->setting).encoding,in_CL);
    std::__cxx11::string::operator=((string *)&this->model_english_name,(string *)&local_e0);
    std::__cxx11::string::~string((string *)&local_e0);
    ReadString_abi_cxx11_
              (&local_100,(pmx *)piStack_18,(istream *)(ulong)(this->setting).encoding,in_CL);
    std::__cxx11::string::operator=((string *)&this->model_comment,(string *)&local_100);
    std::__cxx11::string::~string((string *)&local_100);
    ReadString_abi_cxx11_
              (&local_120,(pmx *)piStack_18,(istream *)(ulong)(this->setting).encoding,in_CL);
    std::__cxx11::string::operator=((string *)&this->model_english_comment,(string *)&local_120);
    std::__cxx11::string::~string((string *)&local_120);
    std::istream::read((char *)piStack_18,(long)&this->vertex_count);
    mmd::make_unique<pmx::PmxVertex[]>((mmd *)&stack0xfffffffffffffed8,(long)this->vertex_count);
    std::unique_ptr<pmx::PmxVertex[],_std::default_delete<pmx::PmxVertex[]>_>::operator=
              (&this->vertices,
               (unique_ptr<pmx::PmxVertex[],_std::default_delete<pmx::PmxVertex[]>_> *)
               &stack0xfffffffffffffed8);
    std::unique_ptr<pmx::PmxVertex[],_std::default_delete<pmx::PmxVertex[]>_>::~unique_ptr
              ((unique_ptr<pmx::PmxVertex[],_std::default_delete<pmx::PmxVertex[]>_> *)
               &stack0xfffffffffffffed8);
    for (local_12c = 0; local_12c < this->vertex_count; local_12c = local_12c + 1) {
      this_00 = std::unique_ptr<pmx::PmxVertex[],_std::default_delete<pmx::PmxVertex[]>_>::
                operator[](&this->vertices,(long)local_12c);
      PmxVertex::Read(this_00,piStack_18,&this->setting);
    }
    std::istream::read((char *)piStack_18,(long)&this->index_count);
    mmd::make_unique<int[]>((mmd *)&stack0xfffffffffffffec8,(long)this->index_count);
    std::unique_ptr<int[],_std::default_delete<int[]>_>::operator=
              (&this->indices,
               (unique_ptr<int[],_std::default_delete<int[]>_> *)&stack0xfffffffffffffec8);
    std::unique_ptr<int[],_std::default_delete<int[]>_>::~unique_ptr
              ((unique_ptr<int[],_std::default_delete<int[]>_> *)&stack0xfffffffffffffec8);
    for (local_13c = 0; local_13c < this->index_count; local_13c = local_13c + 1) {
      iVar1 = ReadIndex(piStack_18,(uint)(this->setting).vertex_index_size);
      piVar4 = std::unique_ptr<int[],_std::default_delete<int[]>_>::operator[]
                         (&this->indices,(long)local_13c);
      *piVar4 = iVar1;
    }
    std::istream::read((char *)piStack_18,(long)&this->texture_count);
    mmd::make_unique<std::__cxx11::string[]>
              ((mmd *)&stack0xfffffffffffffeb8,(long)this->texture_count);
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>[],_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>[]>_>
    ::operator=(&this->textures,
                (unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>[],_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>[]>_>
                 *)&stack0xfffffffffffffeb8);
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>[],_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>[]>_>
    ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>[],_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>[]>_>
                   *)&stack0xfffffffffffffeb8);
    for (local_14c = 0; local_14c < this->texture_count; local_14c = local_14c + 1) {
      ReadString_abi_cxx11_
                (&local_170,(pmx *)piStack_18,(istream *)(ulong)(this->setting).encoding,
                 (uint8_t)this);
      this_01 = std::
                unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>[],_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>[]>_>
                ::operator[](&this->textures,(long)local_14c);
      std::__cxx11::string::operator=((string *)this_01,(string *)&local_170);
      std::__cxx11::string::~string((string *)&local_170);
    }
    std::istream::read((char *)piStack_18,(long)&this->material_count);
    mmd::make_unique<pmx::PmxMaterial[]>((mmd *)&stack0xfffffffffffffe88,(long)this->material_count)
    ;
    std::unique_ptr<pmx::PmxMaterial[],_std::default_delete<pmx::PmxMaterial[]>_>::operator=
              (&this->materials,
               (unique_ptr<pmx::PmxMaterial[],_std::default_delete<pmx::PmxMaterial[]>_> *)
               &stack0xfffffffffffffe88);
    std::unique_ptr<pmx::PmxMaterial[],_std::default_delete<pmx::PmxMaterial[]>_>::~unique_ptr
              ((unique_ptr<pmx::PmxMaterial[],_std::default_delete<pmx::PmxMaterial[]>_> *)
               &stack0xfffffffffffffe88);
    for (local_17c = 0; local_17c < this->material_count; local_17c = local_17c + 1) {
      this_02 = std::unique_ptr<pmx::PmxMaterial[],_std::default_delete<pmx::PmxMaterial[]>_>::
                operator[](&this->materials,(long)local_17c);
      PmxMaterial::Read(this_02,piStack_18,&this->setting);
    }
    std::istream::read((char *)piStack_18,(long)&this->bone_count);
    mmd::make_unique<pmx::PmxBone[]>((mmd *)&stack0xfffffffffffffe78,(long)this->bone_count);
    std::unique_ptr<pmx::PmxBone[],_std::default_delete<pmx::PmxBone[]>_>::operator=
              (&this->bones,
               (unique_ptr<pmx::PmxBone[],_std::default_delete<pmx::PmxBone[]>_> *)
               &stack0xfffffffffffffe78);
    std::unique_ptr<pmx::PmxBone[],_std::default_delete<pmx::PmxBone[]>_>::~unique_ptr
              ((unique_ptr<pmx::PmxBone[],_std::default_delete<pmx::PmxBone[]>_> *)
               &stack0xfffffffffffffe78);
    for (local_18c = 0; local_18c < this->bone_count; local_18c = local_18c + 1) {
      this_03 = std::unique_ptr<pmx::PmxBone[],_std::default_delete<pmx::PmxBone[]>_>::operator[]
                          (&this->bones,(long)local_18c);
      PmxBone::Read(this_03,piStack_18,&this->setting);
    }
    std::istream::read((char *)piStack_18,(long)&this->morph_count);
    mmd::make_unique<pmx::PmxMorph[]>((mmd *)&stack0xfffffffffffffe68,(long)this->morph_count);
    std::unique_ptr<pmx::PmxMorph[],_std::default_delete<pmx::PmxMorph[]>_>::operator=
              (&this->morphs,
               (unique_ptr<pmx::PmxMorph[],_std::default_delete<pmx::PmxMorph[]>_> *)
               &stack0xfffffffffffffe68);
    std::unique_ptr<pmx::PmxMorph[],_std::default_delete<pmx::PmxMorph[]>_>::~unique_ptr
              ((unique_ptr<pmx::PmxMorph[],_std::default_delete<pmx::PmxMorph[]>_> *)
               &stack0xfffffffffffffe68);
    for (local_19c = 0; local_19c < this->morph_count; local_19c = local_19c + 1) {
      this_04 = std::unique_ptr<pmx::PmxMorph[],_std::default_delete<pmx::PmxMorph[]>_>::operator[]
                          (&this->morphs,(long)local_19c);
      PmxMorph::Read(this_04,piStack_18,&this->setting);
    }
    std::istream::read((char *)piStack_18,(long)&this->frame_count);
    mmd::make_unique<pmx::PmxFrame[]>((mmd *)&stack0xfffffffffffffe58,(long)this->frame_count);
    std::unique_ptr<pmx::PmxFrame[],_std::default_delete<pmx::PmxFrame[]>_>::operator=
              (&this->frames,
               (unique_ptr<pmx::PmxFrame[],_std::default_delete<pmx::PmxFrame[]>_> *)
               &stack0xfffffffffffffe58);
    std::unique_ptr<pmx::PmxFrame[],_std::default_delete<pmx::PmxFrame[]>_>::~unique_ptr
              ((unique_ptr<pmx::PmxFrame[],_std::default_delete<pmx::PmxFrame[]>_> *)
               &stack0xfffffffffffffe58);
    for (local_1ac = 0; local_1ac < this->frame_count; local_1ac = local_1ac + 1) {
      this_05 = std::unique_ptr<pmx::PmxFrame[],_std::default_delete<pmx::PmxFrame[]>_>::operator[]
                          (&this->frames,(long)local_1ac);
      PmxFrame::Read(this_05,piStack_18,&this->setting);
    }
    std::istream::read((char *)piStack_18,(long)&this->rigid_body_count);
    mmd::make_unique<pmx::PmxRigidBody[]>
              ((mmd *)&stack0xfffffffffffffe48,(long)this->rigid_body_count);
    std::unique_ptr<pmx::PmxRigidBody[],_std::default_delete<pmx::PmxRigidBody[]>_>::operator=
              (&this->rigid_bodies,
               (unique_ptr<pmx::PmxRigidBody[],_std::default_delete<pmx::PmxRigidBody[]>_> *)
               &stack0xfffffffffffffe48);
    std::unique_ptr<pmx::PmxRigidBody[],_std::default_delete<pmx::PmxRigidBody[]>_>::~unique_ptr
              ((unique_ptr<pmx::PmxRigidBody[],_std::default_delete<pmx::PmxRigidBody[]>_> *)
               &stack0xfffffffffffffe48);
    for (local_1bc = 0; local_1bc < this->rigid_body_count; local_1bc = local_1bc + 1) {
      this_06 = std::unique_ptr<pmx::PmxRigidBody[],_std::default_delete<pmx::PmxRigidBody[]>_>::
                operator[](&this->rigid_bodies,(long)local_1bc);
      PmxRigidBody::Read(this_06,piStack_18,&this->setting);
    }
    std::istream::read((char *)piStack_18,(long)&this->joint_count);
    mmd::make_unique<pmx::PmxJoint[]>((mmd *)&stack0xfffffffffffffe38,(long)this->joint_count);
    std::unique_ptr<pmx::PmxJoint[],_std::default_delete<pmx::PmxJoint[]>_>::operator=
              (&this->joints,
               (unique_ptr<pmx::PmxJoint[],_std::default_delete<pmx::PmxJoint[]>_> *)
               &stack0xfffffffffffffe38);
    std::unique_ptr<pmx::PmxJoint[],_std::default_delete<pmx::PmxJoint[]>_>::~unique_ptr
              ((unique_ptr<pmx::PmxJoint[],_std::default_delete<pmx::PmxJoint[]>_> *)
               &stack0xfffffffffffffe38);
    for (local_1cc = 0; local_1cc < this->joint_count; local_1cc = local_1cc + 1) {
      this_07 = std::unique_ptr<pmx::PmxJoint[],_std::default_delete<pmx::PmxJoint[]>_>::operator[]
                          (&this->joints,(long)local_1cc);
      PmxJoint::Read(this_07,piStack_18,&this->setting);
    }
    return;
  }
  poVar2 = std::operator<<((ostream *)&std::cerr,"invalid magic number.");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  local_55 = 1;
  pDVar3 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_40,"MMD: invalid magic number.",&local_41);
  DeadlyImportError::DeadlyImportError(pDVar3,&local_40);
  local_55 = 0;
  __cxa_throw(pDVar3,&DeadlyImportError::typeinfo,DeadlyImportError::~DeadlyImportError);
}

Assistant:

void PmxModel::Read(std::istream *stream)
	{
		char magic[4];
		stream->read((char*) magic, sizeof(char) * 4);
		if (magic[0] != 0x50 || magic[1] != 0x4d || magic[2] != 0x58 || magic[3] != 0x20)
		{
			std::cerr << "invalid magic number." << std::endl;
      throw DeadlyImportError("MMD: invalid magic number.");
    }
		stream->read((char*) &version, sizeof(float));
		if (version != 2.0f && version != 2.1f)
		{
			std::cerr << "this is not ver2.0 or ver2.1 but " << version << "." << std::endl;
            throw DeadlyImportError("MMD: this is not ver2.0 or ver2.1 but " + to_string(version));
    }
		this->setting.Read(stream);

		this->model_name = ReadString(stream, setting.encoding);
		this->model_english_name = ReadString(stream, setting.encoding);
		this->model_comment = ReadString(stream, setting.encoding);
		this->model_english_comment = ReadString(stream, setting.encoding);

		// read vertices
		stream->read((char*) &vertex_count, sizeof(int));
		this->vertices = mmd::make_unique<PmxVertex []>(vertex_count);
		for (int i = 0; i < vertex_count; i++)
		{
			vertices[i].Read(stream, &setting);
		}

		// read indices
		stream->read((char*) &index_count, sizeof(int));
		this->indices = mmd::make_unique<int []>(index_count);
		for (int i = 0; i < index_count; i++)
		{
			this->indices[i] = ReadIndex(stream, setting.vertex_index_size);
		}

		// read texture names
		stream->read((char*) &texture_count, sizeof(int));
		this->textures = mmd::make_unique<std::string []>(texture_count);
		for (int i = 0; i < texture_count; i++)
		{
			this->textures[i] = ReadString(stream, setting.encoding);
		}

		// read materials
		stream->read((char*) &material_count, sizeof(int));
		this->materials = mmd::make_unique<PmxMaterial []>(material_count);
		for (int i = 0; i < material_count; i++)
		{
			this->materials[i].Read(stream, &setting);
		}

		// read bones
		stream->read((char*) &this->bone_count, sizeof(int));
		this->bones = mmd::make_unique<PmxBone []>(this->bone_count);
		for (int i = 0; i < this->bone_count; i++)
		{
			this->bones[i].Read(stream, &setting);
		}

		// read morphs
		stream->read((char*) &this->morph_count, sizeof(int));
		this->morphs = mmd::make_unique<PmxMorph []>(this->morph_count);
		for (int i = 0; i < this->morph_count; i++)
		{
			this->morphs[i].Read(stream, &setting);
		}

		// read display frames
		stream->read((char*) &this->frame_count, sizeof(int));
		this->frames = mmd::make_unique<PmxFrame []>(this->frame_count);
		for (int i = 0; i < this->frame_count; i++)
		{
			this->frames[i].Read(stream, &setting);
		}

		// read rigid bodies
		stream->read((char*) &this->rigid_body_count, sizeof(int));
		this->rigid_bodies = mmd::make_unique<PmxRigidBody []>(this->rigid_body_count);
		for (int i = 0; i < this->rigid_body_count; i++)
		{
			this->rigid_bodies[i].Read(stream, &setting);
		}

		// read joints
		stream->read((char*) &this->joint_count, sizeof(int));
		this->joints = mmd::make_unique<PmxJoint []>(this->joint_count);
		for (int i = 0; i < this->joint_count; i++)
		{
			this->joints[i].Read(stream, &setting);
		}
	}